

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O2

void delete_variable_declaration(Context_conflict *ctx,MOJOSHADER_astVariableDeclaration *dcl)

{
  if (dcl != (MOJOSHADER_astVariableDeclaration *)0x0) {
    delete_variable_declaration(ctx,dcl->next);
    delete_scalar_or_array(ctx,dcl->details);
    delete_annotation(ctx,dcl->annotations);
    delete_expr(ctx,dcl->initializer);
    delete_variable_lowlevel(ctx,dcl->lowlevel);
    (*ctx->free)(dcl,ctx->malloc_data);
    return;
  }
  return;
}

Assistant:

static void delete_variable_declaration(Context *ctx,
                                        MOJOSHADER_astVariableDeclaration *dcl)
{
    DELETE_AST_NODE(dcl);
    delete_variable_declaration(ctx, dcl->next);
    delete_scalar_or_array(ctx, dcl->details);
    delete_annotation(ctx, dcl->annotations);
    delete_expr(ctx, dcl->initializer);
    delete_variable_lowlevel(ctx, dcl->lowlevel);
    Free(ctx, dcl);
}